

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O0

void __thiscall
xray_re::xr_reader::
r_seq<std::vector<xray_re::way_point_le,std::allocator<xray_re::way_point_le>>,read_point_le>
          (xr_reader *this,vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_> *n,
          vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_> *container)

{
  vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_> *this_00;
  reference point;
  way_point_le local_68;
  vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_> *local_28;
  vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_> *container_local;
  size_t n_local;
  xr_reader *this_local;
  
  local_28 = container;
  container_local = n;
  n_local = (size_t)this;
  std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>::reserve
            (container,(size_type)n);
  while (this_00 = local_28,
        container_local !=
        (vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_> *)0x0) {
    local_68.super_way_point.position.field_0._0_8_ = 0;
    local_68.super_way_point._40_8_ = 0;
    local_68.super_way_point.name.field_2._M_allocated_capacity = 0;
    local_68.super_way_point.name.field_2._8_8_ = 0;
    local_68.super_way_point.name._M_dataplus = (_Alloc_hider)0x0;
    local_68.super_way_point.name._1_7_ = 0;
    local_68.super_way_point.name._M_string_length = 0;
    local_68.id = 0;
    local_68._50_6_ = 0;
    container_local =
         (vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_> *)
         ((long)&container_local[-1].
                 super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    way_point_le::way_point_le(&local_68);
    std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>::push_back
              (this_00,&local_68);
    way_point_le::~way_point_le(&local_68);
    point = std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>::back
                      (local_28);
    read_point_le::operator()((read_point_le *)((long)&this_local + 7),point,this);
  }
  return;
}

Assistant:

inline void xr_reader::r_seq(size_t n, T& container, F read)
{
	container.reserve(n);
	while (n--) {
		container.push_back(typename T::value_type());
		read(container.back(), *this);
	}
}